

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O1

void __thiscall simple_thread_pool::EventAwaiter::wait_us(EventAwaiter *this,size_t time_us)

{
  long lVar1;
  bool bVar2;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  
  LOCK();
  bVar2 = (this->status)._M_i == idle;
  if (bVar2) {
    (this->status)._M_i = ready;
  }
  UNLOCK();
  if (bVar2) {
    local_30._M_device = &this->cvLock;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    LOCK();
    bVar2 = (this->status)._M_i == ready;
    if (bVar2) {
      (this->status)._M_i = waiting;
    }
    UNLOCK();
    if (bVar2) {
      if (time_us == 0) {
        std::condition_variable::wait((unique_lock *)&this->cv);
      }
      else {
        lVar1 = std::chrono::_V2::steady_clock::now();
        local_20.__d.__r = (duration)(time_us * 1000 + lVar1);
        std::condition_variable::
        __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  (&this->cv,&local_30,&local_20);
      }
      LOCK();
      (this->status)._M_i = done;
      UNLOCK();
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  return;
}

Assistant:

void wait_us(size_t time_us) {
        AS expected = AS::idle;
        if (status.compare_exchange_strong(expected, AS::ready)) {
            // invoke() has not been invoked yet, wait for it.
            std::unique_lock<std::mutex> l(cvLock);
            expected = AS::ready;
            if (status.compare_exchange_strong(expected, AS::waiting)) {
                if (time_us) {
                    cv.wait_for(l, std::chrono::microseconds(time_us));
                } else {
                    cv.wait(l);
                }
                status.store(AS::done);
            } else {
                // invoke() has grabbed `cvLock` earlier than this.
            }
        } else {
            // invoke() already has been called earlier than this.
        }
    }